

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBootstrapCommands2.cxx
# Opt level: O1

void GetBootstrapCommands2(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  pointer *pppcVar1;
  iterator iVar2;
  cmSetPropertyCommand *this;
  cmSetPropertyCommand *local_18;
  
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2378
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2408
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2498
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0xb8);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmGetPropertyCommand_005b2258;
  *(_Base_ptr **)&(local_18->Names)._M_t._M_impl =
       &(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  *(undefined8 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined1 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = 0;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)&local_18->PropertyName;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)&(local_18->PropertyName)._M_dataplus._M_p = 0;
  (local_18->PropertyName).field_2._M_allocated_capacity = (size_type)&local_18->PropertyValue;
  *(undefined8 *)((long)&(local_18->PropertyName).field_2 + 8) = 0;
  *(undefined1 *)&(local_18->PropertyValue)._M_dataplus._M_p = 0;
  *(undefined4 *)&(local_18->PropertyValue).field_2 = 0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2540
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b25d0
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b26a8
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b27c8
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2858
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b28e8
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x70);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmInstallCommand_005b2a08;
  *(_Base_ptr **)&(local_18->Names)._M_t._M_impl =
       &(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  *(undefined8 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined1 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = 0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0xa8);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmInstallFilesCommand_005b2978;
  *(undefined8 *)&(local_18->Names)._M_t._M_impl = 0;
  *(undefined8 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)&local_18->PropertyName;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)&(local_18->PropertyName)._M_dataplus._M_p = 0;
  (local_18->PropertyName).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(local_18->PropertyName).field_2 + 8) = 0;
  (local_18->PropertyValue)._M_dataplus._M_p = (pointer)0x0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2a98
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2b28
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2bb8
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2c90
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2db0
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2e40
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2ed0
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2f60
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2ff0
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3080
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3110
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b31a0
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3230
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b32c0
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  this = (cmSetPropertyCommand *)operator_new(200);
  cmSetPropertyCommand::cmSetPropertyCommand(this);
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = this;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)this;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3470
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3350
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3518
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b33e0
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b35a8
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b2738
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3638
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x60);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b36c8
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0xb8);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  *(_Base_ptr **)&(local_18->Names)._M_t._M_impl =
       &(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  *(undefined8 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined1 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = 0;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)&local_18->PropertyName;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)&(local_18->PropertyName)._M_dataplus._M_p = 0;
  (local_18->PropertyName).field_2._M_allocated_capacity = (size_type)&local_18->PropertyValue;
  *(undefined8 *)((long)&(local_18->PropertyName).field_2 + 8) = 0;
  *(undefined1 *)&(local_18->PropertyValue)._M_dataplus._M_p = 0;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCoreTryCompile_005b3758;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x158);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCoreTryCompile_005b39c8;
  *(_Base_ptr **)&(local_18->Names)._M_t._M_impl =
       &(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  *(undefined8 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined1 *)&(local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = 0;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)&local_18->PropertyName;
  (local_18->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)&(local_18->PropertyName)._M_dataplus._M_p = 0;
  (local_18->PropertyName).field_2._M_allocated_capacity = (size_type)&local_18->PropertyValue;
  *(undefined8 *)((long)&(local_18->PropertyName).field_2 + 8) = 0;
  *(undefined1 *)&(local_18->PropertyValue)._M_dataplus._M_p = 0;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmTryRunCommand_005b37e8;
  *(cmSetPropertyCommand **)((long)&(local_18->PropertyValue).field_2 + 8) = local_18 + 1;
  local_18->Remove = false;
  local_18->AppendMode = false;
  local_18->AppendAsString = false;
  *(undefined5 *)&local_18->field_0xc3 = 0;
  *(bool *)&local_18[1].super_cmCommand.super_cmObject._vptr_cmObject = false;
  local_18[1].super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_18[1].super_cmCommand.Helper.Arguments.
                        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                        ._M_impl + 0x10);
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&local_18[1].super_cmCommand.Helper.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl
      + 8))->_M_allocated_capacity = 0;
  *(undefined1 *)
   ((long)&local_18[1].super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = 0;
  local_18[1].super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&local_18[1].super_cmCommand.Error.field_2;
  local_18[1].super_cmCommand.Error._M_string_length = 0;
  local_18[1].super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  *(_Base_ptr **)&local_18[1].Names._M_t._M_impl =
       (_Base_ptr *)((long)&local_18[1].Names._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  *(undefined8 *)&local_18[1].Names._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined1 *)((long)&local_18[1].Names._M_t._M_impl.super__Rb_tree_header._M_header + 8) = 0;
  *(string **)((long)&local_18[1].Names._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       &local_18[1].PropertyName;
  local_18[1].Names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined1 *)&local_18[1].PropertyName._M_dataplus._M_p = 0;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3878
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_18 = (cmSetPropertyCommand *)operator_new(0x50);
  (local_18->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_18->super_cmCommand).Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_18->super_cmCommand).Error._M_dataplus._M_p =
       (pointer)&(local_18->super_cmCommand).Error.field_2;
  (local_18->super_cmCommand).Error._M_string_length = 0;
  (local_18->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (local_18->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (local_18->super_cmCommand).Enabled = true;
  (local_18->super_cmCommand).super_cmObject._vptr_cmObject = (_func_int **)&PTR__cmCommand_005b3908
  ;
  iVar2._M_current =
       (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*>
              ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,iVar2,
               (cmCommand **)&local_18);
  }
  else {
    *iVar2._M_current = (cmCommand *)local_18;
    pppcVar1 = &(commands->super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void GetBootstrapCommands2(std::vector<cmCommand*>& commands)
{
  commands.push_back(new cmGetCMakePropertyCommand);
  commands.push_back(new cmGetDirectoryPropertyCommand);
  commands.push_back(new cmGetFilenameComponentCommand);
  commands.push_back(new cmGetPropertyCommand);
  commands.push_back(new cmGetSourceFilePropertyCommand);
  commands.push_back(new cmGetTargetPropertyCommand);
  commands.push_back(new cmIfCommand);
  commands.push_back(new cmIncludeCommand);
  commands.push_back(new cmIncludeDirectoryCommand);
  commands.push_back(new cmIncludeRegularExpressionCommand);
  commands.push_back(new cmInstallCommand);
  commands.push_back(new cmInstallFilesCommand);
  commands.push_back(new cmInstallTargetsCommand);
  commands.push_back(new cmLinkDirectoriesCommand);
  commands.push_back(new cmListCommand);
  commands.push_back(new cmMacroCommand);
  commands.push_back(new cmMakeDirectoryCommand);
  commands.push_back(new cmMarkAsAdvancedCommand);
  commands.push_back(new cmMathCommand);
  commands.push_back(new cmMessageCommand);
  commands.push_back(new cmOptionCommand);
  commands.push_back(new cmProjectCommand);
  commands.push_back(new cmReturnCommand);
  commands.push_back(new cmSeparateArgumentsCommand);
  commands.push_back(new cmSetCommand);
  commands.push_back(new cmSetDirectoryPropertiesCommand);
  commands.push_back(new cmSetPropertyCommand);
  commands.push_back(new cmSetSourceFilesPropertiesCommand);
  commands.push_back(new cmSetTargetPropertiesCommand);
  commands.push_back(new cmGetTestPropertyCommand);
  commands.push_back(new cmSetTestsPropertiesCommand);
  commands.push_back(new cmSiteNameCommand);
  commands.push_back(new cmStringCommand);
  commands.push_back(new cmSubdirCommand);
  commands.push_back(new cmTargetLinkLibrariesCommand);
  commands.push_back(new cmTryCompileCommand);
  commands.push_back(new cmTryRunCommand);
  commands.push_back(new cmUnsetCommand);
  commands.push_back(new cmWhileCommand);
}